

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_server.c
# Opt level: O0

int deal_info(char *info,PIPE *pipes)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  int local_13f0;
  int local_13ec;
  int j_3;
  int i_2;
  char n [16];
  char getall_info [128];
  int local_1350;
  int local_134c;
  int j_2;
  int i_1;
  char dest [16];
  char src [16];
  char get_info [128];
  int local_129c;
  char local_1298 [4];
  int j_1;
  char chat_info [256];
  int local_118c;
  char local_1188 [4];
  int j;
  char b [16];
  char update_info [256];
  char local_1070 [4];
  int i;
  char val [8];
  char user [16];
  char buf [4096];
  char local_48 [4];
  int new_n;
  char value [16];
  char local_30 [8];
  char para [8];
  char head [8];
  PIPE *pipes_local;
  char *info_local;
  
  __isoc99_sscanf(info,"%[^_]_%[^_]_%s",para,local_30,local_48);
  iVar1 = strcmp(para,"Game");
  if (iVar1 == 0) {
    iVar1 = strcmp(local_30,"new");
    if (iVar1 == 0) {
      iVar1 = atoi(local_48);
      memset(user + 8,0,0x1000);
      builtin_strncpy(user + 8,"info:",5);
      get_rand_char(user + 8,pipes[iVar1].level);
      write(pipes[iVar1].pipe[1],user + 8,0x100);
      if (0x32 < pipes[iVar1].index) {
        pipes[iVar1].index = 1;
      }
      pipes[iVar1].index = pipes[iVar1].index + 1;
    }
    else {
      iVar1 = strcmp(local_30,"update");
      if (iVar1 == 0) {
        __isoc99_sscanf(local_48,"%[^_]_%s",val,local_1070);
        iVar1 = strcmp(local_1070,"s");
        if (iVar1 == 0) {
          update_info[0xfc] = '\0';
          update_info[0xfd] = '\0';
          update_info[0xfe] = '\0';
          update_info[0xff] = '\0';
LAB_001052b9:
          if ((int)update_info._252_4_ < 0x14) {
            if (((pipes[(int)update_info._252_4_].useState & 1U) == 0) ||
               (iVar1 = strcmp(val,pipes[(int)update_info._252_4_].name), iVar1 != 0))
            goto LAB_001054cd;
            pipes[(int)update_info._252_4_].score[pipes[(int)update_info._252_4_].index] =
                 pipes[(int)update_info._252_4_].level * 200 +
                 pipes[(int)update_info._252_4_].score[pipes[(int)update_info._252_4_].index];
            memcpy(b + 8,"update_",0x100);
            sprintf(local_1188,"%d",
                    (ulong)(uint)pipes[(int)update_info._252_4_].score
                                 [pipes[(int)update_info._252_4_].index]);
            strcat(b + 8,pipes[(int)update_info._252_4_].name);
            strcat(b + 8,"_");
            strcat(b + 8,local_1188);
            for (local_118c = 0; local_118c < 0x14; local_118c = local_118c + 1) {
              if ((pipes[local_118c].useState & 1U) == 1) {
                iVar1 = pipes[local_118c].pipe[1];
                sVar2 = strlen(b + 8);
                sVar3 = write(iVar1,b + 8,sVar2);
                if (sVar3 == -1) {
                  printf("Pipe is broken!\n");
                }
              }
            }
          }
        }
      }
      else {
        iVar1 = strcmp(local_30,"chat");
        if (iVar1 == 0) {
          memset(local_1298,0,0x100);
          builtin_strncpy(local_1298,"chat",4);
          j_1._0_1_ = 0x5f;
          strcat(local_1298,local_48);
          for (local_129c = 0; local_129c < 0x14; local_129c = local_129c + 1) {
            if ((pipes[local_129c].useState & 1U) == 1) {
              iVar1 = pipes[local_129c].pipe[1];
              sVar2 = strlen(local_1298);
              sVar3 = write(iVar1,local_1298,sVar2);
              if (sVar3 == -1) {
                printf("Pipe is broken!\n");
              }
            }
          }
        }
        else {
          iVar1 = strcmp(local_30,"get");
          if (iVar1 == 0) {
            memset(src + 8,0,0x80);
            builtin_strncpy(src + 8,"get_",4);
            __isoc99_sscanf(local_48,"%[^_]%s",dest + 8,&j_2);
            for (local_134c = 0; local_134c < 0x14; local_134c = local_134c + 1) {
              iVar1 = strcmp(pipes[local_134c].name,dest + 8);
              if (iVar1 == 0) {
                for (local_1350 = 0; local_1350 < 0x14; local_1350 = local_1350 + 1) {
                  iVar1 = strcmp(pipes[local_1350].name,(char *)&j_2);
                  if (iVar1 == 0) {
                    iVar1 = pipes[local_134c].pipe[1];
                    sVar2 = strlen(src + 8);
                    sVar3 = write(iVar1,src + 8,sVar2);
                    if (sVar3 != -1) break;
                    printf("Pipe is broken!\n");
                  }
                }
              }
            }
          }
          else {
            iVar1 = strcmp(local_30,"getall");
            if (iVar1 == 0) {
              for (local_13ec = 0; local_13ec < 0x14; local_13ec = local_13ec + 1) {
                iVar1 = strcmp(pipes[local_13ec].name,local_48);
                if (iVar1 == 0) {
                  for (local_13f0 = 0; local_13f0 < 0x14; local_13f0 = local_13f0 + 1) {
                    memset(n + 8,0,0x80);
                    strcpy(n + 8,"getall_");
                    strcat(n + 8,"_");
                    strcat(n + 8,pipes[local_13f0].name);
                    strcat(n + 8,"_");
                    sprintf((char *)&j_3,"%d",
                            (ulong)(uint)pipes[local_13f0].score[pipes[local_13f0].index]);
                    iVar1 = pipes[local_13ec].pipe[1];
                    sVar2 = strlen(n + 8);
                    sVar3 = write(iVar1,n + 8,sVar2);
                    if (sVar3 == -1) {
                      printf("Pipe is broken!\n");
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    info_local._4_4_ = 1;
  }
  else {
    printf("Info head is wrong:%s!\n",para);
    info_local._4_4_ = -1;
  }
  return info_local._4_4_;
LAB_001054cd:
  update_info._252_4_ = update_info._252_4_ + 1;
  goto LAB_001052b9;
}

Assistant:

int deal_info(char *info, struct PIPE *pipes){
    char head[8];
    char para[8];
    char value[16];
    int new_n = 0;
    sscanf(info, "%[^_]_%[^_]_%s", head, para, value);
    if(strcmp(head, "Game") != 0){
        printf("Info head is wrong:%s!\n", head);
        return -1;
    }
    if(strcmp(para, "new") == 0){
        new_n = atoi(value);
        char buf[MSG_MAX_SIZE]= "info:";
        get_rand_char(buf, pipes[new_n].level);
        write(pipes[new_n].pipe[1],buf, 256);
        if(pipes[new_n].index > MAX_SONG)
            pipes[new_n].index = 1;
        pipes[new_n].index++;
    } else if(strcmp(para, "update") == 0){
        char user[16];
        char val[8];
        sscanf(value, "%[^_]_%s", user, val);
        if(strcmp(val, "s") == 0){
            for(int i = 0; i < MAX_USER; i++){
                if(pipes[i].useState && strcmp(user, pipes[i].name) == 0){
                    pipes[i].score[pipes[i].index] += PER_SORCE * pipes[i].level;
                    char update_info[256] = "update_";
                    char b[16];
                    sprintf(b, "%d", pipes[i].score[pipes[i].index]);
                    strcat(update_info, pipes[i].name);
                    strcat(update_info, "_");
                    strcat(update_info, b);
                    for(int j = 0; j < MAX_USER; j++){
                        if(pipes[j].useState == true){
                            if(write(pipes[j].pipe[1], update_info, strlen(update_info)) == -1){
                                printf("Pipe is broken!\n");
                                continue;
                            }
                        }
                    }
                    break;
                }
            }

        }
    } else if(strcmp(para, "chat") == 0){
        char chat_info[256] = "chat_";
        strcat(chat_info, value);
        for(int j = 0; j < MAX_USER; j++){
            if(pipes[j].useState == true) {
                if (write(pipes[j].pipe[1], chat_info, strlen(chat_info)) == -1) {
                    printf("Pipe is broken!\n");
                    continue;
                }
            }
        }
    } else if(strcmp(para, "get") == 0){
        char get_info[128] = "get_";
        char src[16];
        char dest[16];
        sscanf(value, "%[^_]%s", src, dest);
        for(int i = 0; i < MAX_USER; i++){
            if(strcmp(pipes[i].name, src) == 0){
                for (int j = 0; j < MAX_USER ; ++j) {
                    if(strcmp(pipes[j].name, dest) == 0){
                        if(write(pipes[i].pipe[1], get_info, strlen(get_info)) == -1){
                            printf("Pipe is broken!\n");
                            continue;
                        }
                        break;
                    }
                }
            }
        }
    } else if(strcmp(para, "getall") == 0){
        char getall_info[128];
        char n[16];
        for(int i = 0; i < MAX_USER; i++) {
            if (strcmp(pipes[i].name, value) == 0) {
                for (int j = 0; j < MAX_USER ; ++j) {
                    memset(getall_info, 0, 128);
                    strcpy(getall_info, "getall_");
                    strcat(getall_info, "_");
                    strcat(getall_info, pipes[j].name);
                    strcat(getall_info, "_");
                    sprintf(n, "%d", pipes[j].score[pipes[j].index]);
                    if(write(pipes[i].pipe[1], getall_info, strlen(getall_info)) == -1){
                        printf("Pipe is broken!\n");
                        continue;
                    }
                }
            }
        }
    }
    return 1;
}